

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteTypeObject(BinaryWriterSpec *this,Type type)

{
  char *s;
  Type local_14;
  
  Stream::Writef(this->json_stream_,"{");
  WriteKey(this,"type");
  s = Type::GetName(&local_14);
  WriteString(this,s);
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteTypeObject(Type type) {
  json_stream_->Writef("{");
  WriteKey("type");
  WriteString(type.GetName());
  json_stream_->Writef("}");
}